

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O1

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::addObjectsToBeDestroyed
          (DelayedDestructor<helics::Core> *this,shared_ptr<helics::Core> *obj)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::vector<std::shared_ptr<helics::Core>,std::allocator<std::shared_ptr<helics::Core>>>::
    emplace_back<std::shared_ptr<helics::Core>>
              ((vector<std::shared_ptr<helics::Core>,std::allocator<std::shared_ptr<helics::Core>>>
                *)&this->ElementsToBeDestroyed,obj);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addObjectsToBeDestroyed(std::shared_ptr<X> obj)
    {
        std::lock_guard<std::timed_mutex> lock(destructionLock);
        ElementsToBeDestroyed.push_back(std::move(obj));
    }